

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmbuffer.c
# Opt level: O3

psize pp_shm_buffer_get_free_space(PShmBuffer *buf)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  
  puVar2 = (ulong *)p_shm_get_address(buf->shm);
  uVar3 = *puVar2;
  uVar1 = puVar2[1];
  if (uVar3 <= uVar1) {
    if (uVar1 <= uVar3) {
      return buf->size - 1;
    }
    uVar3 = uVar3 + buf->size;
  }
  return uVar3 + ~uVar1;
}

Assistant:

static psize
pp_shm_buffer_get_free_space (const PShmBuffer *buf)
{
	psize		read_pos;
	psize		write_pos;
	ppointer	addr;

	addr = p_shm_get_address (buf->shm);

	memcpy (&read_pos, (pchar *) addr + P_SHM_BUFFER_READ_OFFSET, sizeof (read_pos));
	memcpy (&write_pos, (pchar *) addr + P_SHM_BUFFER_WRITE_OFFSET, sizeof (write_pos));

	if (write_pos < read_pos)
		return read_pos - write_pos - 1;
	else if (write_pos > read_pos)
		return buf->size - (write_pos - read_pos) - 1;
	else
		return buf->size - 1;
}